

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O1

JavascriptString * __thiscall
Js::DynamicObjectPropertyEnumerator::MoveAndGetNextWithCache
          (DynamicObjectPropertyEnumerator *this,PropertyId *propertyId,
          PropertyAttributes *attributes)

{
  WriteBarrierPtr<Js::PropertyString> *addr;
  CachedData *pCVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  JavascriptString *pJVar6;
  PropertyString *obj;
  PropertyString *pPVar7;
  int local_3c;
  PropertyId local_38;
  PropertyId tempPropertyId;
  PropertyId tempPropertyId_1;
  PropertyAttributes propertyAttributes;
  
  if (((this->scriptContext).ptr)->threadContext->TTDLog != (EventLog *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                ,0xaa,
                                "(!this->scriptContext->GetThreadContext()->IsRuntimeInTTDMode())",
                                "We should always trap out to explicit enumeration in this case");
    if (!bVar3) goto LAB_00dc23ee;
    *puVar5 = 0;
  }
  if (((this->cachedData).ptr)->cachedCount < this->enumeratedCount) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                ,0xad,"(enumeratedCount <= cachedData->cachedCount)",
                                "enumeratedCount <= cachedData->cachedCount");
    if (!bVar3) goto LAB_00dc23ee;
    *puVar5 = 0;
  }
  tempPropertyId._3_1_ = '\0';
  pCVar1 = (this->cachedData).ptr;
  if (this->enumeratedCount < pCVar1->cachedCount) {
    obj = (pCVar1->strings).ptr[this->enumeratedCount].ptr;
    *propertyId = ((obj->propertyRecordUsageCache).propertyRecord.ptr)->pid;
    MoveAndGetNextNoCache(this,&local_3c,attributes);
    if (local_3c != *propertyId) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                  ,0xba,"(tempPropertyId == propertyId)",
                                  "tempPropertyId == propertyId");
      if (!bVar3) goto LAB_00dc23ee;
      *puVar5 = 0;
    }
    if (this->objectIndex != (((this->cachedData).ptr)->indexes).ptr[this->enumeratedCount]) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                  ,0xbb,
                                  "(this->objectIndex == cachedData->indexes[enumeratedCount])",
                                  "this->objectIndex == cachedData->indexes[enumeratedCount]");
      if (!bVar3) {
LAB_00dc23ee:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    pCVar1 = (this->cachedData).ptr;
    iVar4 = this->enumeratedCount;
    this->objectIndex = (pCVar1->indexes).ptr[iVar4];
    tempPropertyId._3_1_ = (pCVar1->attributes).ptr[iVar4];
    this->enumeratedCount = iVar4 + 1;
  }
  else {
    if (pCVar1->completed == false) {
      obj = (PropertyString *)
            MoveAndGetNextNoCache(this,propertyId,(PropertyAttributes *)((long)&tempPropertyId + 3))
      ;
      if (obj != (PropertyString *)0x0) {
        bVar3 = VarIsImpl<Js::PropertyString>((RecyclableObject *)obj);
        if (bVar3) {
          pPVar7 = UnsafeVarTo<Js::PropertyString,Js::JavascriptString>((JavascriptString *)obj);
        }
        else {
          pPVar7 = (PropertyString *)0x0;
        }
        if (pPVar7 != (PropertyString *)0x0) {
          if (this->initialPropertyCount <= this->enumeratedCount) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar5 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                        ,0xcc,"(enumeratedCount < this->initialPropertyCount)",
                                        "enumeratedCount < this->initialPropertyCount");
            if (!bVar3) goto LAB_00dc23ee;
            *puVar5 = 0;
          }
          addr = (((this->cachedData).ptr)->strings).ptr + this->enumeratedCount;
          Memory::Recycler::WBSetBit((char *)addr);
          addr->ptr = pPVar7;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
          pCVar1 = (this->cachedData).ptr;
          (pCVar1->indexes).ptr[this->enumeratedCount] = this->objectIndex;
          (pCVar1->attributes).ptr[this->enumeratedCount] = tempPropertyId._3_1_;
          iVar4 = this->enumeratedCount + 1;
          this->enumeratedCount = iVar4;
          ((this->cachedData).ptr)->cachedCount = iVar4;
        }
        goto LAB_00dc23d2;
      }
      ((this->cachedData).ptr)->completed = true;
    }
    else {
      pJVar6 = MoveAndGetNextNoCache(this,&local_38,attributes);
      if (pJVar6 != (JavascriptString *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                    ,0xdc,
                                    "(this->MoveAndGetNextNoCache(tempPropertyId, attributes) == nullptr)"
                                    ,
                                    "this->MoveAndGetNextNoCache(tempPropertyId, attributes) == nullptr"
                                   );
        if (!bVar3) goto LAB_00dc23ee;
        *puVar5 = 0;
      }
    }
    obj = (PropertyString *)0x0;
  }
LAB_00dc23d2:
  if (attributes != (PropertyAttributes *)0x0) {
    *attributes = tempPropertyId._3_1_;
  }
  return &obj->super_JavascriptString;
}

Assistant:

JavascriptString * DynamicObjectPropertyEnumerator::MoveAndGetNextWithCache(PropertyId& propertyId, PropertyAttributes* attributes)
    {
#if ENABLE_TTD
        AssertMsg(!this->scriptContext->GetThreadContext()->IsRuntimeInTTDMode(), "We should always trap out to explicit enumeration in this case");
#endif

        Assert(enumeratedCount <= cachedData->cachedCount);
        JavascriptString* propertyStringName;
        PropertyAttributes propertyAttributes = PropertyNone;
        if (enumeratedCount < cachedData->cachedCount)
        {
            PropertyString * propertyString = cachedData->strings[enumeratedCount];
            propertyStringName = propertyString;
            propertyId = propertyString->GetPropertyId();

#if DBG
            PropertyId tempPropertyId;
            /* JavascriptString * tempPropertyString = */ this->MoveAndGetNextNoCache(tempPropertyId, attributes);

            Assert(tempPropertyId == propertyId);
            Assert(this->objectIndex == cachedData->indexes[enumeratedCount]);
#endif

            this->objectIndex = cachedData->indexes[enumeratedCount];
            propertyAttributes = cachedData->attributes[enumeratedCount];

            enumeratedCount++;
        }
        else if (!cachedData->completed)
        {
            propertyStringName = this->MoveAndGetNextNoCache(propertyId, &propertyAttributes);

            if (propertyStringName)
            {
                PropertyString* propertyString = JavascriptOperators::TryFromVar<PropertyString>(propertyStringName);
                if (propertyString != nullptr)
                {
                    Assert(enumeratedCount < this->initialPropertyCount);
                    cachedData->strings[enumeratedCount] = propertyString;
                    cachedData->indexes[enumeratedCount] = this->objectIndex;
                    cachedData->attributes[enumeratedCount] = propertyAttributes;
                    cachedData->cachedCount = ++enumeratedCount;
                }
            }
            else
            {
                cachedData->completed = true;
            }
        }
        else
        {
#if DBG
            PropertyId tempPropertyId;
            Assert(this->MoveAndGetNextNoCache(tempPropertyId, attributes) == nullptr);
#endif

            propertyStringName = nullptr;
        }

        if (attributes != nullptr)
        {
            *attributes = propertyAttributes;
        }

        return propertyStringName;
    }